

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestSuite_Internals.cpp
# Opt level: O2

void __thiscall
psy::C::InternalsTestSuite::reparse
          (InternalsTestSuite *this,string *source,DisambiguationStrategy strategy,Expectation *X)

{
  unique_ptr<psy::C::SyntaxTree,_std::default_delete<psy::C::SyntaxTree>_> *this_00;
  string *__rhs;
  size_type sVar1;
  pointer pSVar2;
  ParseOptions parseOptions;
  pointer __p;
  bool bVar3;
  __type _Var4;
  SyntaxNode *pSVar5;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var6;
  ostream *poVar7;
  ostream *this_01;
  undefined8 uVar8;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  byte bVar9;
  int iVar10;
  iterator __end1;
  iterator __begin1;
  pointer pSVar11;
  string names;
  string textP;
  string text;
  string namesP;
  ParseOptions parseOpts;
  Unparser unparser;
  SyntaxNamePrinter printer;
  string local_410 [32];
  SourceText local_3f0;
  ostringstream ossTree;
  Expectation local_258;
  ostringstream ossText;
  
  std::__cxx11::string::string((string *)&text,(string *)source);
  ParseOptions::ParseOptions(&parseOpts);
  if (strategy == TypeSynonymsVerification) {
    bVar9 = 1;
    ParseOptions::setAmbiguityMode(&parseOpts,DisambiguateAlgorithmically);
  }
  else if (strategy == SyntaxCorrelation) {
    bVar9 = 2;
    ParseOptions::setAmbiguityMode(&parseOpts,DisambiguateAlgorithmically);
  }
  else {
    if (strategy != GuidelineImposition) {
      poVar7 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
      poVar7 = std::operator<<(poVar7,"\tReason: ");
      poVar7 = std::operator<<(poVar7,"unknown strategy");
      poVar7 = std::operator<<(poVar7,"\n");
      poVar7 = std::operator<<(poVar7,"\t\t");
      poVar7 = std::operator<<(poVar7,
                               "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/TestSuite_Internals.cpp"
                              );
      poVar7 = std::operator<<(poVar7,":");
      poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0x138);
      std::endl<char,std::char_traits<char>>(poVar7);
      uVar8 = __cxa_allocate_exception(1);
      __cxa_throw(uVar8,&TestFailed::typeinfo,0);
    }
    ParseOptions::setAmbiguityMode(&parseOpts,DisambiguateHeuristically);
    bVar9 = 0;
  }
  std::__cxx11::string::string(local_410,(string *)&text);
  psy::SourceText::SourceText(&local_3f0,local_410);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ossTree,"",(allocator<char> *)&printer);
  parseOptions.langExts_.translations_ =
       (MacroTranslations)(MacroTranslations)parseOpts.langExts_.translations_.field_0;
  parseOptions.langDialect_.std_ = parseOpts.langDialect_.std_;
  parseOptions._1_7_ = parseOpts._1_7_;
  parseOptions.langExts_.field_1.BF_all_ = parseOpts.langExts_.field_1.BF_all_;
  parseOptions.field_2 = parseOpts.field_2;
  parseOptions._26_6_ = parseOpts._26_6_;
  SyntaxTree::parseText
            ((SourceText *)&ossText,(TextPreprocessingState)&local_3f0,Unknown,parseOptions,
             (string *)(ulong)bVar9,(SyntaxCategory)&ossTree);
  __p = _ossText;
  this_00 = &this->tree_;
  _ossText = (pointer)0x0;
  std::__uniq_ptr_impl<psy::C::SyntaxTree,_std::default_delete<psy::C::SyntaxTree>_>::reset
            ((__uniq_ptr_impl<psy::C::SyntaxTree,_std::default_delete<psy::C::SyntaxTree>_> *)
             this_00,__p);
  std::unique_ptr<psy::C::SyntaxTree,_std::default_delete<psy::C::SyntaxTree>_>::~unique_ptr
            ((unique_ptr<psy::C::SyntaxTree,_std::default_delete<psy::C::SyntaxTree>_> *)&ossText);
  std::__cxx11::string::~string((string *)&ossTree);
  std::__cxx11::string::~string((string *)&local_3f0);
  std::__cxx11::string::~string(local_410);
  if (X->containsAmbiguity_ == false) {
    Expectation::Expectation(&local_258,X);
    bVar3 = checkErrorAndWarn(this,&local_258);
    Expectation::~Expectation(&local_258);
    if (!bVar3) goto LAB_0039a6af;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&ossTree);
  SyntaxNamePrinter::SyntaxDumper
            (&printer,(this_00->_M_t).
                      super___uniq_ptr_impl<psy::C::SyntaxTree,_std::default_delete<psy::C::SyntaxTree>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_psy::C::SyntaxTree_*,_std::default_delete<psy::C::SyntaxTree>_>
                      .super__Head_base<0UL,_psy::C::SyntaxTree_*,_false>._M_head_impl);
  pSVar5 = SyntaxTree::root((this_00->_M_t).
                            super___uniq_ptr_impl<psy::C::SyntaxTree,_std::default_delete<psy::C::SyntaxTree>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_psy::C::SyntaxTree_*,_std::default_delete<psy::C::SyntaxTree>_>
                            .super__Head_base<0UL,_psy::C::SyntaxTree_*,_false>._M_head_impl);
  SyntaxNamePrinter::print(&printer,pSVar5,Plain,(ostream *)&ossTree);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&ossText);
  Unparser::SyntaxDumper
            (&unparser,
             (this_00->_M_t).
             super___uniq_ptr_impl<psy::C::SyntaxTree,_std::default_delete<psy::C::SyntaxTree>_>.
             _M_t.
             super__Tuple_impl<0UL,_psy::C::SyntaxTree_*,_std::default_delete<psy::C::SyntaxTree>_>.
             super__Head_base<0UL,_psy::C::SyntaxTree_*,_false>._M_head_impl);
  pSVar5 = SyntaxTree::root((this_00->_M_t).
                            super___uniq_ptr_impl<psy::C::SyntaxTree,_std::default_delete<psy::C::SyntaxTree>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_psy::C::SyntaxTree_*,_std::default_delete<psy::C::SyntaxTree>_>
                            .super__Head_base<0UL,_psy::C::SyntaxTree_*,_false>._M_head_impl);
  Unparser::unparse(&unparser,pSVar5,(ostream *)&ossText);
  std::__cxx11::stringbuf::str();
  _Var6 = std::
          __remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_pred<int(*)(int)noexcept>>
                    ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )textP._M_dataplus._M_p,
                     (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )(textP._M_dataplus._M_p + textP._M_string_length),
                     (_Iter_pred<int_(*)(int)_noexcept>)isspace);
  std::__cxx11::string::erase
            (&textP,_Var6._M_current,textP._M_dataplus._M_p + textP._M_string_length);
  _Var6 = std::
          __remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_pred<int(*)(int)noexcept>>
                    ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )text._M_dataplus._M_p,
                     (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )(text._M_dataplus._M_p + text._M_string_length),
                     (_Iter_pred<int_(*)(int)_noexcept>)isspace);
  std::__cxx11::string::erase(&text,_Var6._M_current,text._M_dataplus._M_p + text._M_string_length);
  if (X->containsAmbiguity_ == true) {
    sVar1 = (X->ambiguityText_)._M_string_length;
    if (sVar1 == 0) {
      std::operator+(&names,&text,&text);
      _Var4 = std::operator==(&textP,&names);
      std::__cxx11::string::~string((string *)&names);
      uVar8 = extraout_RDX_01;
      if (!_Var4) {
        poVar7 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
        poVar7 = std::operator<<(poVar7,"\t\tActual  : ");
        poVar7 = std::operator<<(poVar7,(string *)&textP);
        poVar7 = std::operator<<(poVar7,"\n");
        poVar7 = std::operator<<(poVar7,"\t\tExpected: ");
        std::operator+(&names,&text,&text);
        poVar7 = std::operator<<(poVar7,(string *)&names);
        poVar7 = std::operator<<(poVar7,"\n");
        poVar7 = std::operator<<(poVar7,"\t\t");
        poVar7 = std::operator<<(poVar7,
                                 "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/TestSuite_Internals.cpp"
                                );
        poVar7 = std::operator<<(poVar7,":");
        poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0x15d);
        std::endl<char,std::char_traits<char>>(poVar7);
        std::__cxx11::string::~string((string *)&names);
        goto LAB_0039a550;
      }
    }
    else {
      __rhs = &X->ambiguityText_;
      _Var6._M_current = (__rhs->_M_dataplus)._M_p;
      _Var6 = std::
              __remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_pred<int(*)(int)noexcept>>
                        (_Var6,_Var6._M_current + sVar1,(_Iter_pred<int_(*)(int)_noexcept>)isspace);
      std::__cxx11::string::erase
                (__rhs,_Var6._M_current,
                 (X->ambiguityText_)._M_dataplus._M_p + (X->ambiguityText_)._M_string_length);
      _Var4 = std::operator==(&textP,__rhs);
      uVar8 = extraout_RDX;
      if (!_Var4) {
        poVar7 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
        poVar7 = std::operator<<(poVar7,"\t\tActual  : ");
        poVar7 = std::operator<<(poVar7,(string *)&textP);
        poVar7 = std::operator<<(poVar7,"\n");
        poVar7 = std::operator<<(poVar7,"\t\tExpected: ");
        poVar7 = std::operator<<(poVar7,(string *)__rhs);
        poVar7 = std::operator<<(poVar7,"\n");
        poVar7 = std::operator<<(poVar7,"\t\t");
        poVar7 = std::operator<<(poVar7,
                                 "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/TestSuite_Internals.cpp"
                                );
        this_01 = (ostream *)std::operator<<(poVar7,":");
        iVar10 = 0x163;
        goto LAB_0039a540;
      }
    }
  }
  else {
    _Var4 = std::operator==(&textP,&text);
    uVar8 = extraout_RDX_00;
    if (!_Var4) {
      poVar7 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
      poVar7 = std::operator<<(poVar7,"\t\tActual  : ");
      poVar7 = std::operator<<(poVar7,(string *)&textP);
      poVar7 = std::operator<<(poVar7,"\n");
      poVar7 = std::operator<<(poVar7,"\t\tExpected: ");
      poVar7 = std::operator<<(poVar7,(string *)&text);
      poVar7 = std::operator<<(poVar7,"\n");
      poVar7 = std::operator<<(poVar7,"\t\t");
      poVar7 = std::operator<<(poVar7,
                               "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/TestSuite_Internals.cpp"
                              );
      this_01 = (ostream *)std::operator<<(poVar7,":");
      iVar10 = 0x167;
LAB_0039a540:
      poVar7 = (ostream *)std::ostream::operator<<(this_01,iVar10);
      std::endl<char,std::char_traits<char>>(poVar7);
LAB_0039a550:
      uVar8 = __cxa_allocate_exception(1);
      __cxa_throw(uVar8,&TestFailed::typeinfo,0);
    }
  }
  pSVar11 = (X->syntaxKinds_).
            super__Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>._M_impl.
            super__Vector_impl_data._M_start;
  pSVar2 = (X->syntaxKinds_).
           super__Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pSVar11 != pSVar2) {
    names._M_dataplus._M_p = (pointer)&names.field_2;
    names._M_string_length = 0;
    names.field_2._M_local_buf[0] = '\0';
    for (; pSVar11 != pSVar2; pSVar11 = pSVar11 + 1) {
      to_string_abi_cxx11_(&namesP,(C *)(ulong)*pSVar11,(SyntaxKind)uVar8);
      std::__cxx11::string::append((string *)&names);
      std::__cxx11::string::~string((string *)&namesP);
      uVar8 = extraout_RDX_02;
    }
    std::__cxx11::stringbuf::str();
    _Var6 = std::
            __remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_pred<int(*)(int)noexcept>>
                      ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )namesP._M_dataplus._M_p,
                       (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )(namesP._M_dataplus._M_p + namesP._M_string_length),
                       (_Iter_pred<int_(*)(int)_noexcept>)isspace);
    std::__cxx11::string::erase
              (&namesP,_Var6._M_current,namesP._M_dataplus._M_p + namesP._M_string_length);
    _Var4 = std::operator==(&namesP,&names);
    if (!_Var4) {
      poVar7 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
      poVar7 = std::operator<<(poVar7,"\t\tActual  : ");
      poVar7 = std::operator<<(poVar7,(string *)&namesP);
      poVar7 = std::operator<<(poVar7,"\n");
      poVar7 = std::operator<<(poVar7,"\t\tExpected: ");
      poVar7 = std::operator<<(poVar7,(string *)&names);
      poVar7 = std::operator<<(poVar7,"\n");
      poVar7 = std::operator<<(poVar7,"\t\t");
      poVar7 = std::operator<<(poVar7,
                               "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/TestSuite_Internals.cpp"
                              );
      poVar7 = std::operator<<(poVar7,":");
      poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0x172);
      std::endl<char,std::char_traits<char>>(poVar7);
      uVar8 = __cxa_allocate_exception(1);
      __cxa_throw(uVar8,&TestFailed::typeinfo,0);
    }
    std::__cxx11::string::~string((string *)&namesP);
    std::__cxx11::string::~string((string *)&names);
  }
  std::__cxx11::string::~string((string *)&textP);
  SyntaxVisitor::~SyntaxVisitor((SyntaxVisitor *)&unparser);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ossText);
  SyntaxNamePrinter::~SyntaxNamePrinter(&printer);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ossTree);
LAB_0039a6af:
  std::__cxx11::string::~string((string *)&text);
  return;
}

Assistant:

void InternalsTestSuite::reparse(std::string source,
                                 Reparser::DisambiguationStrategy strategy,
                                 Expectation X)
{
    auto text = source;

    ParseOptions parseOpts;
    TextCompleteness textCompleness;
    switch (strategy) {
        case Reparser::DisambiguationStrategy::SyntaxCorrelation:
            parseOpts.setAmbiguityMode(
                        ParseOptions::AmbiguityMode::DisambiguateAlgorithmically);
            textCompleness = TextCompleteness::Fragment;
            break;

        case Reparser::DisambiguationStrategy::TypeSynonymsVerification:
            parseOpts.setAmbiguityMode(
                        ParseOptions::AmbiguityMode::DisambiguateAlgorithmically);
            textCompleness = TextCompleteness::Full;
            break;

        case Reparser::DisambiguationStrategy::GuidelineImposition:
            parseOpts.setAmbiguityMode(
                        ParseOptions::AmbiguityMode::DisambiguateHeuristically);
            textCompleness = TextCompleteness::Unknown;
            break;

        default:
            PSY__internals__FAIL("unknown strategy");
    }

    tree_ = SyntaxTree::parseText(text,
                                  TextPreprocessingState::Unknown,
                                  textCompleness,
                                  parseOpts,
                                  "");

    if (!X.containsAmbiguity_ && !checkErrorAndWarn(X))
        return;

    std::ostringstream ossTree;
    SyntaxNamePrinter printer(tree_.get());
    printer.print(tree_->root(),
                  SyntaxNamePrinter::Style::Plain,
                  ossTree);

#ifdef DUMP_AST
    std::cout << "\n\n"
              << "========================== AST ==================================\n"
              << source << "\n"
              << "-----------------------------------------------------------------"
              << ossTree.str()
              << "=================================================================\n";
#endif

    std::ostringstream ossText;
    Unparser unparser(tree_.get());
    unparser.unparse(tree_->root(), ossText);

    std::string textP = ossText.str();
    textP.erase(std::remove_if(textP.begin(), textP.end(), ::isspace), textP.end());
    text.erase(std::remove_if(text.begin(), text.end(), ::isspace), text.end());

    if (X.containsAmbiguity_) {
        if (X.ambiguityText_.empty())
            PSY_EXPECT_EQ_STR(textP, text + text);
        else {
            X.ambiguityText_.erase(
                        std::remove_if(X.ambiguityText_.begin(),
                                       X.ambiguityText_.end(), ::isspace),
                        X.ambiguityText_.end());
            PSY_EXPECT_EQ_STR(textP, X.ambiguityText_);
        }
    }
    else
        PSY_EXPECT_EQ_STR(textP, text);

    if (X.syntaxKinds_.empty())
        return;

    std::string names;
    for (auto k : X.syntaxKinds_)
        names += to_string(k);

    std::string namesP = ossTree.str();
    namesP.erase(std::remove_if(namesP.begin(), namesP.end(), ::isspace), namesP.end());
    PSY_EXPECT_EQ_STR(namesP, names);
}